

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O1

bool __thiscall UniValue::findKey(UniValue *this,string *key,size_t *retIdx)

{
  long lVar1;
  pointer pbVar2;
  pointer __s2;
  size_t sVar3;
  size_t __n;
  int iVar4;
  size_type *psVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  long in_FS_OFFSET;
  bool bVar9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar2 = (this->keys).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->keys).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
  bVar9 = lVar6 != 0;
  if (bVar9) {
    uVar7 = lVar6 >> 5;
    __s2 = (key->_M_dataplus)._M_p;
    sVar3 = key->_M_string_length;
    psVar5 = &pbVar2->_M_string_length;
    sVar8 = 0;
    do {
      __n = *psVar5;
      if ((__n == sVar3) &&
         ((__n == 0 ||
          (iVar4 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar5 + -1))->_M_dataplus)._M_p,__s2,__n), iVar4 == 0)))) {
        *retIdx = sVar8;
        break;
      }
      sVar8 = sVar8 + 1;
      bVar9 = sVar8 < uVar7;
      psVar5 = psVar5 + 4;
    } while (uVar7 + (uVar7 == 0) != sVar8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool UniValue::findKey(const std::string& key, size_t& retIdx) const
{
    for (size_t i = 0; i < keys.size(); i++) {
        if (keys[i] == key) {
            retIdx = i;
            return true;
        }
    }

    return false;
}